

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::setChildIndicatorPolicy(QTreeWidgetItem *this,ChildIndicatorPolicy policy)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*(int *)(*(long *)(in_RDI + 0x30) + 0x28) != in_ESI) &&
     (*(int *)(*(long *)(in_RDI + 0x30) + 0x28) = in_ESI, *(long *)(in_RDI + 0x28) != 0)) {
    QAbstractItemView::scheduleDelayedItemsLayout
              ((QAbstractItemView *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void QTreeWidgetItem::setChildIndicatorPolicy(QTreeWidgetItem::ChildIndicatorPolicy policy)
{
    if (d->policy == policy)
        return;
    d->policy = policy;

    if (!view)
        return;

    view->scheduleDelayedItemsLayout();
}